

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall gutil::PropertyNode::addChild(PropertyNode *this,string *_name,string *_value)

{
  string *_value_00;
  string *in_RDX;
  PropertyNode *in_RSI;
  size_t i;
  string *in_stack_ffffffffffffff68;
  PropertyNode *in_stack_ffffffffffffff70;
  string local_70 [32];
  string *in_stack_ffffffffffffffb0;
  PropertyNode *in_stack_ffffffffffffffb8;
  string local_40 [32];
  
  _value_00 = (string *)std::__cxx11::string::find_first_of((char)in_RSI,0x2e);
  if (_value_00 == (string *)0xffffffffffffffff) {
    getChild(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bc88);
    setValue(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)in_RSI);
    getChild(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    std::__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x11bbe3);
    std::__cxx11::string::substr((ulong)local_70,(ulong)in_RSI);
    addChild(in_RSI,in_RDX,_value_00);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void addChild(const std::string &_name, const std::string &_value)
    {
      size_t i=_name.find_first_of('.');

      if (i != std::string::npos)
      {
        getChild(_name.substr(0, i))->addChild(_name.substr(i+1), _value);
      }
      else
      {
        getChild(_name)->setValue(_value);
      }
    }